

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

example * VW::new_unused_example(vw *all)

{
  example *peVar1;
  long in_RDI;
  example *ec;
  vw *in_stack_fffffffffffffff0;
  
  peVar1 = get_unused_example(in_stack_fffffffffffffff0);
  (**(code **)(*(long *)(in_RDI + 8) + 0x330))(&peVar1->l);
  *(long *)(*(long *)(in_RDI + 8) + 0x220) = *(long *)(*(long *)(in_RDI + 8) + 0x220) + 1;
  peVar1->example_counter = *(size_t *)(*(long *)(in_RDI + 8) + 0x220);
  return peVar1;
}

Assistant:

example* new_unused_example(vw& all)
{
  example* ec = &get_unused_example(&all);
  all.p->lp.default_label(&ec->l);
  all.p->begin_parsed_examples++;
  ec->example_counter = (size_t)all.p->begin_parsed_examples;
  return ec;
}